

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::Block::__render_output_abi_cxx11_(string *__return_storage_ptr__,Block *this)

{
  bool bVar1;
  string local_1f0 [48];
  reference local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *segment;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  stringstream output;
  ostream local_190 [376];
  Block *local_18;
  Block *this_local;
  
  local_18 = this;
  this_local = (Block *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->__output_segments);
  segment = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->__output_segments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&segment);
    if (!bVar1) break;
    local_1c0 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    std::operator<<(local_190,(string *)local_1c0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->__output_segments);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::Block::__render_output() {
    std::stringstream output;
    for (auto &segment : __output_segments) {
        output << segment;
    }
    __output_segments.clear();
    return std::move(output.str());
}